

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_quaternion.c
# Opt level: O0

char * test_quaternion_360_degree_eulers(void)

{
  short sVar1;
  double local_48;
  double out_anglez;
  double out_angley;
  double out_anglex;
  quaternion q1;
  
  quaternion_set_from_euler_anglesf3((quaternion *)&out_anglex,0.0,6.370451927185059,0.0);
  quaternion_get_euler_anglesf3((quaternion *)&out_anglex,&out_angley,&out_anglez,&local_48);
  sVar1 = scalar_equalsf(0.0,out_angley);
  if (sVar1 == 0) {
    q1.field_0.q[3] = (double)anon_var_dwarf_399;
  }
  else {
    sVar1 = scalar_equalsf(5.0,out_anglez * 57.295780181884766);
    if (sVar1 == 0) {
      q1.field_0.q[3] = (double)anon_var_dwarf_3b0;
    }
    else {
      sVar1 = scalar_equalsf(0.0,local_48);
      if (sVar1 == 0) {
        q1.field_0.q[3] = (double)anon_var_dwarf_3c7;
      }
      else {
        q1.field_0.q[3] = 0.0;
      }
    }
  }
  return (char *)q1.field_0.q[3];
}

Assistant:

static char *test_quaternion_360_degree_eulers(void)
{
	struct quaternion q1;
	HYP_FLOAT out_anglex, out_angley, out_anglez;

	/* set the original quaternions with the eulers */
	quaternion_set_from_euler_anglesf3(&q1, 0.0f, HYP_DEG_TO_RAD(365.0f), 0.0f);

	/* get the angles */
	quaternion_get_euler_anglesf3(&q1, &out_anglex, &out_angley, &out_anglez);

	test_assert(scalar_equals(0.0f, out_anglex));

	/* should be 5 degrees, quaternion will normalize the value */
	test_assert(scalar_equals(5.0f, HYP_RAD_TO_DEG(out_angley)));

	test_assert(scalar_equals(0.0f, out_anglez));

	return NULL;
}